

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O0

int64_t hdr_interval_recorder_record_values(hdr_interval_recorder *r,int64_t value,int64_t count)

{
  int64_t local_38;
  int64_t params [3];
  int64_t count_local;
  int64_t value_local;
  hdr_interval_recorder *r_local;
  
  params[1] = 0;
  local_38 = value;
  params[0] = count;
  params[2] = count;
  hdr_interval_recorder_update(r,update_values,&local_38);
  return params[1];
}

Assistant:

int64_t hdr_interval_recorder_record_values(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count
)
{
    int64_t params[3];
    params[0] = value;
    params[1] = count;
    params[2] = 0;

    hdr_interval_recorder_update(r, update_values, &params[0]);
    return params[2];
}